

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void jpgd::jpeg_decoder::decode_block_ac_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  int iVar1;
  int iVar2;
  coeff_buf *pcVar3;
  uint8 *puVar4;
  huff_tables *phVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  
  if (pD->m_eob_run == 0) {
    pcVar3 = pD->m_ac_coeffs[component_id];
    iVar1 = pcVar3->block_num_x;
    if ((iVar1 <= block_x) || (pcVar3->block_num_y <= block_y)) {
LAB_00151a92:
      stop_decoding(pD,JPGD_DECODE_ERROR);
    }
    iVar11 = pD->m_spectral_start;
    if (iVar11 <= pD->m_spectral_end) {
      iVar2 = pcVar3->block_size;
      puVar4 = pcVar3->pData;
      do {
        if ((7 < (ulong)(uint)pD->m_comp_ac_tab[component_id]) ||
           (phVar5 = pD->m_pHuff_tabs[(uint)pD->m_comp_ac_tab[component_id]],
           phVar5 == (huff_tables *)0x0)) goto LAB_00151a92;
        uVar12 = (ulong)(int)phVar5->look_up[pD->m_bit_buf >> 0x18];
        if ((long)uVar12 < 0) {
          iVar9 = -8;
          do {
            uVar8 = -(uint)((pD->m_bit_buf >> (iVar9 + 0x1fU & 0x1f) & 1) != 0) - (int)uVar12;
            if (((int)(iVar9 + 0x1fU) < 0) || (0x1ff < uVar8)) goto LAB_00151a92;
            uVar12 = (ulong)phVar5->tree[uVar8];
            iVar9 = iVar9 + -1;
          } while ((int)phVar5->tree[uVar8] < 0);
          uVar8 = -iVar9;
        }
        else {
          if (0xff < (int)phVar5->look_up[pD->m_bit_buf >> 0x18]) {
            __assert_fail("symbol < JPGD_HUFF_CODE_SIZE_MAX_LENGTH",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                          ,0x227,"int jpgd::jpeg_decoder::huff_decode(huff_tables *)");
          }
          uVar8 = (uint)phVar5->code_size[uVar12];
        }
        get_bits_no_markers(pD,uVar8);
        uVar10 = uVar12 >> 4 & 0xfffffff;
        uVar8 = (uint)uVar12 & 0xf;
        iVar9 = (int)uVar10;
        if ((uVar12 & 0xf) == 0) {
          if (iVar9 == 0xf) {
            if (0x30 < iVar11) goto LAB_00151a92;
            bVar6 = true;
            iVar9 = iVar11 + 0xf;
          }
          else {
            pD->m_eob_run = 1 << ((byte)uVar10 & 0x1f);
            if (0xf < (uint)uVar12) {
              uVar7 = get_bits_no_markers(pD,iVar9);
              pD->m_eob_run = pD->m_eob_run + uVar7;
            }
            pD->m_eob_run = pD->m_eob_run + -1;
            bVar6 = false;
            iVar9 = iVar11;
          }
        }
        else {
          iVar9 = iVar9 + iVar11;
          if (0x3f < iVar9) goto LAB_00151a92;
          uVar7 = get_bits_no_markers(pD,uVar8);
          if ((int)uVar7 < *(int *)(s_extend_test + (ulong)uVar8 * 4)) {
            uVar7 = uVar7 + *(int *)(s_extend_offset + (ulong)uVar8 * 4);
          }
          *(short *)(puVar4 + (long)(int)(&g_ZAG)[iVar9] * 2 +
                              (long)(iVar1 * block_y * iVar2) + (long)(block_x * iVar2)) =
               (short)(uVar7 << ((byte)pD->m_successive_low & 0x1f));
          bVar6 = true;
        }
      } while ((bVar6) && (iVar11 = iVar9 + 1, iVar9 < pD->m_spectral_end));
    }
  }
  else {
    pD->m_eob_run = pD->m_eob_run + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_first(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		int k, s, r;

		if (pD->m_eob_run)
		{
			pD->m_eob_run--;
			return;
		}

		jpgd_block_coeff_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);

		for (k = pD->m_spectral_start; k <= pD->m_spectral_end; k++)
		{
			unsigned int idx = pD->m_comp_ac_tab[component_id];
			if (idx >= JPGD_MAX_HUFF_TABLES)
				pD->stop_decoding(JPGD_DECODE_ERROR);

			s = pD->huff_decode(pD->m_pHuff_tabs[idx]);

			r = s >> 4;
			s &= 15;

			if (s)
			{
				if ((k += r) > 63)
					pD->stop_decoding(JPGD_DECODE_ERROR);

				r = pD->get_bits_no_markers(s);
				s = JPGD_HUFF_EXTEND(r, s);

				p[g_ZAG[k]] = static_cast<jpgd_block_coeff_t>(s << pD->m_successive_low);
			}
			else
			{
				if (r == 15)
				{
					if ((k += 15) > 63)
						pD->stop_decoding(JPGD_DECODE_ERROR);
				}
				else
				{
					pD->m_eob_run = 1 << r;

					if (r)
						pD->m_eob_run += pD->get_bits_no_markers(r);

					pD->m_eob_run--;

					break;
				}
			}
		}
	}